

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_devices.cpp
# Opt level: O0

void print_device_collection(cubeb_device_collection *collection,FILE *f)

{
  long in_RDI;
  uint32_t i;
  FILE *in_stack_000000f8;
  cubeb_device_info *in_stack_00000100;
  undefined4 local_14;
  
  for (local_14 = 0; (ulong)local_14 < *(ulong *)(in_RDI + 8); local_14 = local_14 + 1) {
    print_device_info(in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

static void
print_device_collection(cubeb_device_collection * collection, FILE * f)
{
  uint32_t i;

  for (i = 0; i < collection->count; i++)
    print_device_info(&collection->device[i], f);
}